

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O3

void Io_NtkWriteNets(FILE *pFile,Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  Abc_Obj_t *pObj;
  long *plVar4;
  long *plVar5;
  Abc_Obj_t *pAVar6;
  long lVar7;
  ProgressBar *p;
  Vec_Ptr_t *pVVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                  ,0x19a,"void Io_NtkWriteNets(FILE *, Abc_Ntk_t *)");
  }
  lVar7 = (long)pNtk->vObjs->nSize;
  if (lVar7 < 1) {
    uVar12 = 0;
  }
  else {
    lVar11 = 0;
    uVar12 = 0;
    do {
      pvVar3 = pNtk->vObjs->pArray[lVar11];
      if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 6)) {
        uVar12 = uVar12 + *(int *)((long)pvVar3 + 0x1c) + *(int *)((long)pvVar3 + 0x2c);
      }
      lVar11 = lVar11 + 1;
    } while (lVar7 != lVar11);
  }
  printf("NumNets  : %d\t",(ulong)(uint)pNtk->nObjCounts[6]);
  printf("NumPins      : %d\n\n",(ulong)uVar12);
  fwrite("UCLA    nets    1.0\n",0x14,1,(FILE *)pFile);
  fprintf((FILE *)pFile,"NumNets : %d\n",(ulong)(uint)pNtk->nObjCounts[6]);
  fprintf((FILE *)pFile,"NumPins : %d\n",(ulong)uVar12);
  p = Extra_ProgressBarStart(_stdout,pNtk->nObjCounts[6]);
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar8->pArray[lVar7];
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 6)) {
        if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar7)) {
          Extra_ProgressBarUpdate_int(p,(int)lVar7,(char *)0x0);
        }
        iVar1 = (pObj->vFanouts).nSize;
        iVar2 = (pObj->vFanins).nSize;
        pcVar9 = Abc_ObjName((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]);
        fprintf((FILE *)pFile,"NetDegree\t:\t\t%d\t\t%s\n",(ulong)(uint)(iVar1 + iVar2),pcVar9);
        plVar4 = (long *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 2) {
          pcVar9 = Abc_ObjName(pObj);
          fprintf((FILE *)pFile,"i%s_input I\n",pcVar9);
        }
        else {
          if (pObj->pNtk->nObjCounts[8] == 0) {
LAB_00344415:
            if (0 < *(int *)((long)plVar4 + 0x1c)) {
              lVar11 = 0;
              do {
                pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                      (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                      (long)*(int *)(plVar4[4] + lVar11 * 4) * 8));
                fprintf((FILE *)pFile,"%s_",pcVar9);
                lVar11 = lVar11 + 1;
              } while (lVar11 < *(int *)((long)plVar4 + 0x1c));
            }
LAB_00344454:
            if (0 < *(int *)((long)plVar4 + 0x2c)) {
              lVar11 = 0;
              do {
                pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                      (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                      (long)*(int *)(plVar4[6] + lVar11 * 4) * 8));
                fprintf((FILE *)pFile,"%s_",pcVar9);
                lVar11 = lVar11 + 1;
              } while (lVar11 < *(int *)((long)plVar4 + 0x2c));
            }
            if (pObj->pNtk->ntkFunc == ABC_FUNC_MAP) {
              pcVar9 = Mio_GateReadName((Mio_Gate_t *)plVar4[7]);
              fprintf((FILE *)pFile,"%s : ",pcVar9);
            }
            else {
              fwrite("name I : ",9,1,(FILE *)pFile);
            }
          }
          else {
            if (*(int *)((long)plVar4 + 0x1c) == 0) goto LAB_00344454;
            plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)plVar4[4] * 8);
            if ((*(uint *)((long)plVar5 + 0x14) & 0xf) != 8) goto LAB_00344415;
            lVar11 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
            plVar4 = *(long **)(lVar11 + (long)*(int *)plVar5[4] * 8);
            plVar5 = *(long **)(lVar11 + (long)*(int *)plVar5[6] * 8);
            pAVar6 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[6] * 8);
            pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                  (long)*(int *)plVar4[4] * 8));
            pcVar10 = Abc_ObjName(pAVar6);
            fprintf((FILE *)pFile,"%s_%s_latch I : ",pcVar9,pcVar10);
          }
          fprintf((FILE *)pFile,"%.2f %.2f\n",0,0);
        }
        if (0 < (pObj->vFanouts).nSize) {
          lVar11 = 0;
          do {
            plVar4 = (long *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar11]];
            if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 3) {
              pcVar9 = Abc_ObjName(pObj);
              fprintf((FILE *)pFile,"o%s_output O\n",pcVar9);
            }
            else {
              if (((pObj->pNtk->nObjCounts[8] == 0) || (*(int *)((long)plVar4 + 0x2c) == 0)) ||
                 (plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                     (long)*(int *)plVar4[6] * 8),
                 (*(uint *)((long)plVar5 + 0x14) & 0xf) != 8)) {
                if (0 < *(int *)((long)plVar4 + 0x1c)) {
                  lVar13 = 0;
                  do {
                    pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                          (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                          (long)*(int *)(plVar4[4] + lVar13 * 4) * 8));
                    fprintf((FILE *)pFile,"%s_",pcVar9);
                    lVar13 = lVar13 + 1;
                  } while (lVar13 < *(int *)((long)plVar4 + 0x1c));
                }
                if (0 < *(int *)((long)plVar4 + 0x2c)) {
                  lVar13 = 0;
                  do {
                    pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                          (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                          (long)*(int *)(plVar4[6] + lVar13 * 4) * 8));
                    fprintf((FILE *)pFile,"%s_",pcVar9);
                    lVar13 = lVar13 + 1;
                  } while (lVar13 < *(int *)((long)plVar4 + 0x2c));
                }
                if (pObj->pNtk->ntkFunc == ABC_FUNC_MAP) {
                  pcVar9 = Mio_GateReadName((Mio_Gate_t *)plVar4[7]);
                  fprintf((FILE *)pFile,"%s : ",pcVar9);
                }
                else {
                  fwrite("name O : ",9,1,(FILE *)pFile);
                }
              }
              else {
                lVar13 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
                plVar4 = *(long **)(lVar13 + (long)*(int *)plVar5[4] * 8);
                plVar5 = *(long **)(lVar13 + (long)*(int *)plVar5[6] * 8);
                pAVar6 = *(Abc_Obj_t **)
                          (*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[6] * 8);
                pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                      (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                      (long)*(int *)plVar4[4] * 8));
                pcVar10 = Abc_ObjName(pAVar6);
                fprintf((FILE *)pFile,"%s_%s_latch O : ",pcVar9,pcVar10);
              }
              fprintf((FILE *)pFile,"%.2f %.2f\n",0,0);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < (pObj->vFanouts).nSize);
        }
      }
      lVar7 = lVar7 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar7 < pVVar8->nSize);
  }
  Extra_ProgressBarStop(p);
  return;
}

Assistant:

void Io_NtkWriteNets( FILE * pFile, Abc_Ntk_t * pNtk )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pNet;
    unsigned numPin=0;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    // write the head
    Abc_NtkForEachNet( pNtk, pNet, i )
    numPin+=Abc_ObjFaninNum(pNet)+Abc_ObjFanoutNum(pNet);
    printf( "NumNets  : %d\t", Abc_NtkNetNum(pNtk) );
    printf( "NumPins      : %d\n\n", numPin );
    fprintf( pFile, "UCLA    nets    1.0\n");
    fprintf( pFile, "NumNets : %d\n", Abc_NtkNetNum(pNtk) );
    fprintf( pFile, "NumPins : %d\n", numPin );

    // write nets
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkNetNum(pNtk) );
    Abc_NtkForEachNet( pNtk, pNet, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        Io_NtkWriteIntNet( pFile, pNet );
    }
    Extra_ProgressBarStop( pProgress );
}